

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void Commands::ReloadPub(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *arguments,Command_Source *from)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  bool quiet;
  int iVar1;
  undefined4 extraout_var;
  undefined8 local_40 [4];
  
  (*from->_vptr_Command_Source[2])(local_40);
  Console::Out("Pub files reloaded by %s",local_40[0]);
  std::__cxx11::string::~string((string *)local_40);
  __lhs = (arguments->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if ((arguments->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish == __lhs) {
    quiet = true;
  }
  else {
    quiet = std::operator!=(__lhs,"announce");
  }
  iVar1 = (*from->_vptr_Command_Source[4])(from);
  World::ReloadPub((World *)CONCAT44(extraout_var,iVar1),quiet);
  return;
}

Assistant:

void ReloadPub(const std::vector<std::string>& arguments, Command_Source* from)
{
	(void)arguments;

	Console::Out("Pub files reloaded by %s", from->SourceName().c_str());

	bool quiet = true;

	if (arguments.size() >= 1)
		quiet = (arguments[0] != "announce");

	from->SourceWorld()->ReloadPub(quiet);
}